

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Fts5Structure * fts5IndexOptimizeStruct(Fts5Index *p,Fts5Structure *pStruct)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Fts5StructureSegment *pFVar4;
  long lVar5;
  Fts5Structure *p_00;
  Fts5StructureSegment *pFVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  iVar1 = pStruct->nSegment;
  lVar5 = 0;
  if (1 < (long)iVar1) {
    uVar2 = pStruct->nLevel;
    uVar7 = 0;
    if (0 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    for (; uVar7 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
      iVar3 = *(int *)((long)&pStruct->aLevel[0].nSeg + lVar5);
      if ((iVar3 == iVar1) ||
         ((iVar3 == iVar1 + -1 && (*(int *)((long)&pStruct->aLevel[0].nMerge + lVar5) == iVar1 + -1)
          ))) {
        pStruct->nRef = pStruct->nRef + 1;
        return pStruct;
      }
    }
    p_00 = (Fts5Structure *)sqlite3Fts5MallocZero(&p->rc,(long)(int)uVar2 * 0x10 + 0x38);
    if (p_00 != (Fts5Structure *)0x0) {
      p_00->nLevel = pStruct->nLevel + 1;
      p_00->nRef = 1;
      p_00->nWriteCounter = pStruct->nWriteCounter;
      iVar3 = pStruct->nLevel;
      pFVar6 = (Fts5StructureSegment *)sqlite3Fts5MallocZero(&p->rc,(long)iVar1 * 0xc);
      p_00->aLevel[iVar3].aSeg = pFVar6;
      if (pFVar6 != (Fts5StructureSegment *)0x0) {
        lVar5 = 0;
        uVar7 = (ulong)(uint)pStruct->nLevel;
        while (0 < (int)uVar7) {
          lVar5 = (long)(int)lVar5;
          lVar9 = 0;
          for (lVar8 = 0; lVar8 < pStruct->aLevel[uVar7 - 1].nSeg; lVar8 = lVar8 + 1) {
            pFVar6 = p_00->aLevel[iVar3].aSeg;
            pFVar4 = pStruct->aLevel[uVar7 - 1].aSeg;
            *(undefined4 *)((long)&pFVar6[lVar5].pgnoLast + lVar9) =
                 *(undefined4 *)((long)&pFVar4->pgnoLast + lVar9);
            *(undefined8 *)((long)&pFVar6[lVar5].iSegid + lVar9) =
                 *(undefined8 *)((long)&pFVar4->iSegid + lVar9);
            lVar9 = lVar9 + 0xc;
          }
          lVar5 = lVar5 + lVar8;
          uVar7 = uVar7 - 1;
        }
        p_00->aLevel[iVar3].nSeg = iVar1;
        p_00->nSegment = iVar1;
        return p_00;
      }
      sqlite3_free(p_00);
    }
  }
  return (Fts5Structure *)0x0;
}

Assistant:

static Fts5Structure *fts5IndexOptimizeStruct(
  Fts5Index *p, 
  Fts5Structure *pStruct
){
  Fts5Structure *pNew = 0;
  sqlite3_int64 nByte = sizeof(Fts5Structure);
  int nSeg = pStruct->nSegment;
  int i;

  /* Figure out if this structure requires optimization. A structure does
  ** not require optimization if either:
  **
  **  + it consists of fewer than two segments, or 
  **  + all segments are on the same level, or
  **  + all segments except one are currently inputs to a merge operation.
  **
  ** In the first case, return NULL. In the second, increment the ref-count
  ** on *pStruct and return a copy of the pointer to it.
  */
  if( nSeg<2 ) return 0;
  for(i=0; i<pStruct->nLevel; i++){
    int nThis = pStruct->aLevel[i].nSeg;
    if( nThis==nSeg || (nThis==nSeg-1 && pStruct->aLevel[i].nMerge==nThis) ){
      fts5StructureRef(pStruct);
      return pStruct;
    }
    assert( pStruct->aLevel[i].nMerge<=nThis );
  }

  nByte += (pStruct->nLevel+1) * sizeof(Fts5StructureLevel);
  pNew = (Fts5Structure*)sqlite3Fts5MallocZero(&p->rc, nByte);

  if( pNew ){
    Fts5StructureLevel *pLvl;
    nByte = nSeg * sizeof(Fts5StructureSegment);
    pNew->nLevel = pStruct->nLevel+1;
    pNew->nRef = 1;
    pNew->nWriteCounter = pStruct->nWriteCounter;
    pLvl = &pNew->aLevel[pStruct->nLevel];
    pLvl->aSeg = (Fts5StructureSegment*)sqlite3Fts5MallocZero(&p->rc, nByte);
    if( pLvl->aSeg ){
      int iLvl, iSeg;
      int iSegOut = 0;
      /* Iterate through all segments, from oldest to newest. Add them to
      ** the new Fts5Level object so that pLvl->aSeg[0] is the oldest
      ** segment in the data structure.  */
      for(iLvl=pStruct->nLevel-1; iLvl>=0; iLvl--){
        for(iSeg=0; iSeg<pStruct->aLevel[iLvl].nSeg; iSeg++){
          pLvl->aSeg[iSegOut] = pStruct->aLevel[iLvl].aSeg[iSeg];
          iSegOut++;
        }
      }
      pNew->nSegment = pLvl->nSeg = nSeg;
    }else{
      sqlite3_free(pNew);
      pNew = 0;
    }
  }

  return pNew;
}